

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unaryByComponent<unsigned_int>::call
          (unaryByComponent<unsigned_int> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  uint uVar2;
  undefined4 uVar3;
  uint local_44;
  GLuint component;
  functionPointer p_function;
  GLdouble *p_arg;
  uint *p_result;
  GLuint n_components;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unaryByComponent<unsigned_int> *this_local;
  
  uVar2 = Utils::getNumberOfComponentsForVariableType
                    (*(_variable_type *)&(this->super_unaryBase).super_functionObject.field_0x24);
  pcVar1 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  for (local_44 = 0; local_44 < uVar2; local_44 = local_44 + 1) {
    uVar3 = (*pcVar1)(*(undefined8 *)((long)argument_src + (ulong)local_44 * 8));
    *(undefined4 *)((long)result_dst + (ulong)local_44 * 4) = uVar3;
  }
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		glw::GLuint	n_components = Utils::getNumberOfComponentsForVariableType(m_arg_type);
		ResT*		   p_result		= (ResT*)result_dst;
		glw::GLdouble* p_arg		= (glw::GLdouble*)argument_src;

		functionPointer p_function = (functionPointer)m_p_function;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			p_result[component] = p_function(p_arg[component]);
		}
	}